

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O3

void __thiscall SkipList::put(SkipList *this,uint64_t key,string *value)

{
  mt19937 *this_00;
  size_type sVar1;
  pointer pcVar2;
  SkipList *pSVar3;
  Node *pNVar4;
  result_type_conflict rVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Node *pNVar7;
  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_> path;
  Node *local_d8;
  SkipList *local_d0;
  char *local_c8;
  size_type local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  char *local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  local_48._0_16_ = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_88._16_16_ = (undefined1  [16])0x0;
  local_88._0_16_ = (undefined1  [16])0x0;
  std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::_M_initialize_map
            ((_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *)local_88,0);
  local_d8 = this->head;
  local_d0 = this;
  if (local_d8 != (Node *)0x0) {
    do {
      pNVar7 = local_d8->right;
      while (pNVar4 = pNVar7, pNVar4 != (Node *)0x0) {
        if (key <= pNVar4->key) {
          if (pNVar4->key == key) {
            local_d0->valueSize =
                 (local_d0->valueSize - (pNVar4->value)._M_string_length) + value->_M_string_length;
            do {
              std::__cxx11::string::_M_assign((string *)&pNVar4->value);
              pNVar4 = pNVar4->down;
            } while (pNVar4 != (Node *)0x0);
            goto LAB_00109855;
          }
          break;
        }
        local_d8 = pNVar4;
        pNVar7 = pNVar4->right;
      }
      if ((_Elt_pointer)local_58._0_8_ == (_Elt_pointer)(local_48._0_8_ + -8)) {
        std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>::
        _M_push_back_aux<SkipList::Node*const&>
                  ((deque<SkipList::Node*,std::allocator<SkipList::Node*>> *)local_88,&local_d8);
      }
      else {
        *(Node **)local_58._0_8_ = local_d8;
        local_58._0_8_ = (_Elt_pointer)(local_58._0_8_ + 8);
      }
      local_d8 = local_d8->down;
    } while (local_d8 != (Node *)0x0);
  }
  this_00 = &local_d0->mt;
  pNVar7 = (Node *)0x0;
  do {
    pSVar3 = local_d0;
    if (local_58._0_8_ == local_88._16_8_) {
      local_d8 = local_d0->head;
      pNVar4 = (Node *)operator_new(0x38);
      pNVar4->right = (Node *)0x0;
      pNVar4->down = (Node *)0x0;
      pNVar4->key = 0;
      (pNVar4->value)._M_dataplus._M_p = (pointer)&(pNVar4->value).field_2;
      (pNVar4->value)._M_string_length = 0;
      (pNVar4->value).field_2._M_local_buf[0] = '\0';
      pSVar3->head = pNVar4;
      pNVar4 = (Node *)operator_new(0x38);
      pcVar2 = (value->_M_dataplus)._M_p;
      local_a8 = &local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,pcVar2,pcVar2 + value->_M_string_length);
      pNVar4->right = (Node *)0x0;
      pNVar4->down = pNVar7;
      pNVar4->key = key;
      paVar6 = &(pNVar4->value).field_2;
      (pNVar4->value)._M_dataplus._M_p = (pointer)paVar6;
      if (local_a8 == &local_98) {
        paVar6->_M_allocated_capacity = CONCAT71(uStack_97,local_98);
        *(undefined8 *)((long)&(pNVar4->value).field_2 + 8) = uStack_90;
      }
      else {
        (pNVar4->value)._M_dataplus._M_p = local_a8;
        (pNVar4->value).field_2._M_allocated_capacity = CONCAT71(uStack_97,local_98);
      }
      (pNVar4->value)._M_string_length = local_a0;
      local_a0 = 0;
      local_98 = '\0';
      pNVar7 = local_d0->head;
      pNVar7->right = pNVar4;
      pNVar7->down = local_d8;
      local_a8 = &local_98;
      break;
    }
    if (local_58._0_8_ == local_58._8_8_) {
      local_d8 = (*(_Map_pointer)(local_48._8_8_ + -8))[0x3f];
      operator_delete((void *)local_58._8_8_,0x200);
      local_58._8_8_ = *(_Map_pointer)(local_48._8_8_ + -8);
      local_48._8_8_ = (_Map_pointer)(local_48._8_8_ + -8);
      local_48._0_8_ = (_Elt_pointer)(local_58._8_8_ + 0x200);
      local_58._0_8_ = local_58._8_8_ + 0x1f8;
    }
    else {
      local_d8 = *(_Elt_pointer)(local_58._0_8_ + -8);
      local_58._0_8_ = local_58._0_8_ + -8;
    }
    pNVar4 = (Node *)operator_new(0x38);
    pcVar2 = (value->_M_dataplus)._M_p;
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,pcVar2 + value->_M_string_length);
    pNVar4->right = local_d8->right;
    pNVar4->down = pNVar7;
    pNVar4->key = key;
    paVar6 = &(pNVar4->value).field_2;
    (pNVar4->value)._M_dataplus._M_p = (pointer)paVar6;
    if (local_c8 == &local_b8) {
      paVar6->_M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
      *(undefined8 *)((long)&(pNVar4->value).field_2 + 8) = uStack_b0;
    }
    else {
      (pNVar4->value)._M_dataplus._M_p = local_c8;
      (pNVar4->value).field_2._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
    }
    (pNVar4->value)._M_string_length = local_c0;
    local_c0 = 0;
    local_b8 = '\0';
    local_d8->right = pNVar4;
    pNVar7 = local_d8->right;
    local_c8 = &local_b8;
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
  } while ((rVar5 & 1) != 0);
  sVar1 = value->_M_string_length;
  local_d0->length = local_d0->length + 1;
  local_d0->valueSize = sVar1 + local_d0->valueSize;
LAB_00109855:
  std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::~_Deque_base
            ((_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *)local_88);
  return;
}

Assistant:

void SkipList::put(uint64_t key, const string &value) {
  // if key exists, update the value of all nodes
  static auto update = [](Node *p, const string &value) {
    while (p) {
      p->value = value;
      p = p->down;
    }
  };

  // find the place to insert
  stack<Node *> path;
  Node *p = head;
  while (p) {
    while (p->right && p->right->key < key) p = p->right;
    // if key exists
    if (p->right && p->right->key == key) {
      valueSize -= p->right->value.size();
      valueSize += value.size();
      update(p->right, value);
      return;
    }
    path.push(p);
    p = p->down;
  }

  // insert and grow up
  bool grow = true;
  Node *down = nullptr;
  while (grow && !path.empty()) {
    p = path.top();
    path.pop();
    p->right = new Node(key, value, p->right, down);
    down = p->right;
    grow = shouldGrowUp();
  }

  // height + 1
  if (grow) {
    p = head;
    head = new Node;
    head->right = new Node(key, value, nullptr, down);
    head->down = p;
  }

  length++;
  valueSize += value.size();
}